

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandSim(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  char *pcVar2;
  char *local_58;
  char *pFileSim;
  int fVerbose;
  int fMiter;
  int TimeOut;
  int nWords;
  int nFrames;
  int fComb;
  int fNew;
  int c;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  nFrames = 0;
  TimeOut = 0x20;
  fMiter = 8;
  fVerbose = 0x1e;
  pFileSim._4_4_ = 1;
  pFileSim._0_4_ = 0;
  local_58 = (char *)0x0;
  Extra_UtilGetoptReset();
LAB_00248540:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"FWTAnmvh");
    if (iVar1 == -1) {
      if (pNtk_00 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar1 = Abc_NtkIsStrash(pNtk_00);
      if (iVar1 == 0) {
        Abc_Print(-1,"Only works for strashed networks.\n");
        return 1;
      }
      if ((local_58 != (char *)0x0) && (iVar1 = Abc_NtkLatchNum(pNtk_00), iVar1 != 0)) {
        Abc_Print(-1,
                  "Currently simulation with user-specified patterns works only for comb miters.\n")
        ;
        return 1;
      }
      if (pNtk_00->pSeqModel != (Abc_Cex_t *)0x0) {
        free(pNtk_00->pSeqModel);
        pNtk_00->pSeqModel = (Abc_Cex_t *)0x0;
      }
      iVar1 = Abc_NtkDarSeqSim(pNtk_00,TimeOut,fMiter,fVerbose,nFrames,pFileSim._4_4_,(uint)pFileSim
                               ,local_58);
      pAbc->Status = iVar1;
      Abc_FrameReplaceCex(pAbc,&pNtk_00->pSeqModel);
      return 0;
    }
    switch(iVar1) {
    case 0x41:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-A\" should be followed by a file name.\n");
        goto LAB_00248846;
      }
      local_58 = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_00248540;
    default:
      goto LAB_00248846;
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_00248846;
      }
      TimeOut = atoi(argv[globalUtilOptind]);
      iVar1 = TimeOut;
      break;
    case 0x54:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
        goto LAB_00248846;
      }
      fVerbose = atoi(argv[globalUtilOptind]);
      iVar1 = fVerbose;
      break;
    case 0x57:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-W\" should be followed by an integer.\n");
        goto LAB_00248846;
      }
      fMiter = atoi(argv[globalUtilOptind]);
      iVar1 = fMiter;
      break;
    case 0x68:
      goto LAB_00248846;
    case 0x6d:
      pFileSim._4_4_ = pFileSim._4_4_ ^ 1;
      goto LAB_00248540;
    case 0x6e:
      nFrames = nFrames ^ 1;
      goto LAB_00248540;
    case 0x76:
      pFileSim._0_4_ = (uint)pFileSim ^ 1;
      goto LAB_00248540;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_00248846:
      Abc_Print(-2,"usage: sim [-FWT num] [-A file] [-nmvh]\n");
      Abc_Print(-2,"\t          performs random simulation of the sequential miter\n");
      Abc_Print(-2,"\t-F num  : the number of frames to simulate [default = %d]\n",
                (ulong)(uint)TimeOut);
      Abc_Print(-2,"\t-W num  : the number of words to simulate [default = %d]\n",
                (ulong)(uint)fMiter);
      Abc_Print(-2,"\t-T num  : approximate runtime limit in seconds [default = %d]\n",
                (ulong)(uint)fVerbose);
      Abc_Print(-2,
                "\t-A file : text file name with user\'s patterns [default = random simulation]\n");
      Abc_Print(-2,"\t          (patterns are listed, one per line, as sequences of 0s and 1s)\n");
      pcVar2 = "old";
      if (nFrames != 0) {
        pcVar2 = "new";
      }
      Abc_Print(-2,"\t-n      : toggle new vs. old implementation [default = %s]\n",pcVar2);
      pcVar2 = "circuit";
      if (pFileSim._4_4_ != 0) {
        pcVar2 = "miter";
      }
      Abc_Print(-2,"\t-m      : toggle miter vs. any circuit [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if ((uint)pFileSim != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-v      : toggle printing verbose information [default = %s]\n",pcVar2);
      Abc_Print(-2,"\t-h      : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandSim( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fNew;
    int fComb;
    int nFrames;
    int nWords;
    int TimeOut;
    int fMiter;
    int fVerbose;
    char * pFileSim;
    extern int Abc_NtkDarSeqSim( Abc_Ntk_t * pNtk, int nFrames, int nWords, int TimeOut, int fNew, int fMiter, int fVerbose, char * pFileSim );
    // set defaults
    fNew       =  0;
    fComb      =  0;
    nFrames    = 32;
    nWords     =  8;
    TimeOut    = 30;
    fMiter     =  1;
    fVerbose   =  0;
    pFileSim   = NULL;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FWTAnmvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nWords < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            TimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( TimeOut < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by a file name.\n" );
                goto usage;
            }
            pFileSim = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'n':
            fNew ^= 1;
            break;
        case 'm':
            fMiter ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Only works for strashed networks.\n" );
        return 1;
    }
    if ( pFileSim != NULL && Abc_NtkLatchNum(pNtk) )
    {
        Abc_Print( -1, "Currently simulation with user-specified patterns works only for comb miters.\n" );
        return 1;
    }
    ABC_FREE( pNtk->pSeqModel );
    pAbc->Status = Abc_NtkDarSeqSim( pNtk, nFrames, nWords, TimeOut, fNew, fMiter, fVerbose, pFileSim );
    Abc_FrameReplaceCex( pAbc, &pNtk->pSeqModel );
    return 0;

usage:
    Abc_Print( -2, "usage: sim [-FWT num] [-A file] [-nmvh]\n" );
    Abc_Print( -2, "\t          performs random simulation of the sequential miter\n" );
    Abc_Print( -2, "\t-F num  : the number of frames to simulate [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-W num  : the number of words to simulate [default = %d]\n", nWords );
    Abc_Print( -2, "\t-T num  : approximate runtime limit in seconds [default = %d]\n", TimeOut );
    Abc_Print( -2, "\t-A file : text file name with user's patterns [default = random simulation]\n" );
    Abc_Print( -2, "\t          (patterns are listed, one per line, as sequences of 0s and 1s)\n" );
    Abc_Print( -2, "\t-n      : toggle new vs. old implementation [default = %s]\n", fNew? "new": "old" );
    Abc_Print( -2, "\t-m      : toggle miter vs. any circuit [default = %s]\n", fMiter? "miter": "circuit" );
    Abc_Print( -2, "\t-v      : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}